

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::WaitStatement::fromSyntax
          (Compilation *compilation,WaitStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  StatementSyntax *pSVar4;
  undefined4 extraout_var_00;
  WaitStatement *stmt;
  Statement *pSVar5;
  SourceRange sourceRange;
  SourceRange local_40;
  Expression *args;
  
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  pSVar4 = not_null<slang::syntax::StatementSyntax_*>::get(&syntax->statement);
  iVar2 = Statement::bind((int)pSVar4,(sockaddr *)context,(socklen_t)stmtCtx);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::WaitStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,
                    (Statement *)CONCAT44(extraout_var_00,iVar2),&local_40);
  bVar1 = Expression::bad(args);
  if (((!bVar1) && (((Statement *)CONCAT44(extraout_var_00,iVar2))->kind != Invalid)) &&
     (bVar1 = ASTContext::requireBooleanConvertible(context,args), bVar1)) {
    if ((((context->flags).m_bits & 0x6000) == 0) &&
       (bVar1 = ASTContext::inAlwaysCombLatch(context), !bVar1)) {
      return &stmt->super_Statement;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x460008,sourceRange);
  }
  pSVar5 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar5;
}

Assistant:

Statement& WaitStatement::fromSyntax(Compilation& compilation, const WaitStatementSyntax& syntax,
                                     const ASTContext& context, StatementContext& stmtCtx) {
    auto& cond = Expression::bind(*syntax.expr, context);
    auto& stmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<WaitStatement>(cond, stmt, syntax.sourceRange());
    if (cond.bad() || stmt.bad())
        return badStmt(compilation, result);

    if (!context.requireBooleanConvertible(cond))
        return badStmt(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) || context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}